

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.h
# Opt level: O2

bool __thiscall crnlib::sparse_bit_array::get_bit(sparse_bit_array *this,uint index)

{
  if (this->m_ppGroups[index >> 9] != (uint32 *)0x0) {
    return (*(uint *)((long)this->m_ppGroups[index >> 9] + (ulong)(index >> 3 & 0x3c)) >>
            (index & 0x1f) & 1) != 0;
  }
  return false;
}

Assistant:

inline bool get_bit(uint index) const {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup)
      return 0;

    uint bit_ofs = index & (cBitsPerGroup - 1);

    uint bit = (1U << (bit_ofs & 31));

    return (pGroup[bit_ofs >> 5] & bit) != 0;
  }